

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O2

void __thiscall
amrex::AmrLevel::UpdateDistributionMaps(AmrLevel *this,DistributionMapping *update_dmap)

{
  element_type *peVar1;
  pointer pSVar2;
  long *plVar3;
  long lVar4;
  int i;
  long lVar5;
  long lVar6;
  
  peVar1 = (update_dmap->m_ref).
           super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  lVar6 = (long)*(pointer *)
                 ((long)&(peVar1->m_pmap).super_vector<int,_std::allocator<int>_>.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) -
          *(long *)&(peVar1->m_pmap).super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl;
  peVar1 = (this->dmap).m_ref.
           super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((long)*(pointer *)
             ((long)&(peVar1->m_pmap).super_vector<int,_std::allocator<int>_>.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) -
      *(long *)&(peVar1->m_pmap).super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl == lVar6) {
    std::__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)
               &this->dmap,
               (__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)
               update_dmap);
  }
  lVar4 = 0x98;
  for (lVar5 = 0;
      pSVar2 = (this->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
               super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
               super__Vector_impl_data._M_start,
      lVar5 < ((long)(this->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>
                     .super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pSVar2) / 0xe0;
      lVar5 = lVar5 + 1) {
    plVar3 = *(long **)((long)&(pSVar2->domain).smallend + lVar4 + -0x10);
    if (plVar3[1] - *plVar3 == lVar6) {
      std::__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(pSVar2->domain).smallend + lVar4 + -0x10),
                 (__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)
                 update_dmap);
    }
    lVar4 = lVar4 + 0xe0;
  }
  return;
}

Assistant:

void
AmrLevel::UpdateDistributionMaps ( DistributionMapping& update_dmap )
{
    Long mapsize = update_dmap.size();

    if (dmap.size() == mapsize)
    { dmap = update_dmap; }

    for (int i = 0; i < state.size(); ++i)
    {
       if (state[i].DistributionMap().size() == mapsize)
          { state[i].setDistributionMap(update_dmap); }
    }
}